

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  SessionHandle *data_00;
  timeval newer;
  int iVar1;
  _Bool _Var2;
  uint uVar3;
  CURLcode CVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  timeval tVar9;
  char *local_e0;
  long local_d0;
  char local_a8 [4];
  int rc;
  char ipaddress [46];
  __time_t _Stack_70;
  int other;
  __suseconds_t local_68;
  uint local_60;
  int i;
  int result;
  timeval now;
  int error;
  long allow;
  CURLcode code;
  SessionHandle *data;
  _Bool *connected_local;
  int sockindex_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  allow._4_4_ = CURLE_OK;
  now.tv_usec._4_4_ = 0;
  *connected = false;
  if (((conn->bits).tcpconnect[sockindex] & 1U) == 0) {
    tVar9 = curlx_tvnow();
    _Stack_70 = tVar9.tv_sec;
    _i = _Stack_70;
    local_68 = tVar9.tv_usec;
    now.tv_sec = local_68;
    lVar5 = Curl_timeleft(data_00,(timeval *)&i,true);
    if (lVar5 < 0) {
      Curl_failf(data_00,"Connection time-out");
      conn_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      for (local_60 = 0; (int)local_60 < 2; local_60 = local_60 + 1) {
        if (conn->tempsock[(int)local_60] != -1) {
          uVar3 = Curl_socket_check(-1,-1,conn->tempsock[(int)local_60],0);
          if (uVar3 == 0) {
            tVar9.tv_usec = now.tv_sec;
            tVar9.tv_sec = _i;
            lVar6 = curlx_tvdiff(tVar9,conn->connecttime);
            if (conn->timeoutms_per_addr <= lVar6) {
              Curl_infof(data_00,"After %ldms connect time, move on!\n",conn->timeoutms_per_addr);
              now.tv_usec._4_4_ = 0x6e;
            }
            if (((local_60 == 0) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (newer.tv_usec = now.tv_sec, newer.tv_sec = _i,
               lVar6 = curlx_tvdiff(newer,conn->connecttime), 199 < lVar6)) {
              trynextip(conn,sockindex,1);
            }
          }
          else if (uVar3 == 2) {
            _Var2 = verifyconnect(conn->tempsock[(int)local_60],(int *)((long)&now.tv_usec + 4));
            if (_Var2) {
              register0x00000000 = local_60 ^ 1;
              conn->sock[sockindex] = conn->tempsock[(int)local_60];
              conn->ip_addr = conn->tempaddr[(int)local_60];
              conn->tempsock[(int)local_60] = -1;
              if (conn->tempsock[(int)register0x00000000] != -1) {
                Curl_closesocket(conn,conn->tempsock[(int)register0x00000000]);
                conn->tempsock[(int)stack0xffffffffffffff8c] = -1;
              }
              CVar4 = Curl_connected_proxy(conn,sockindex);
              if (CVar4 != CURLE_OK) {
                return CVar4;
              }
              (conn->bits).tcpconnect[sockindex] = true;
              *connected = true;
              if (sockindex == 0) {
                Curl_pgrsTime(data_00,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[sockindex]);
              Curl_verboseconnect(conn);
              return CURLE_OK;
            }
            Curl_infof(data_00,"Connection failed\n");
          }
          else if ((uVar3 & 4) != 0) {
            verifyconnect(conn->tempsock[(int)local_60],(int *)((long)&now.tv_usec + 4));
          }
          iVar1 = now.tv_usec._4_4_;
          if (now.tv_usec._4_4_ != 0) {
            (data_00->state).os_errno = now.tv_usec._4_4_;
            piVar7 = __errno_location();
            *piVar7 = iVar1;
            if (conn->tempaddr[(int)local_60] != (Curl_addrinfo *)0x0) {
              Curl_printable_address(conn->tempaddr[(int)local_60],local_a8,0x2e);
              lVar6 = conn->port;
              pcVar8 = Curl_strerror(conn,now.tv_usec._4_4_);
              Curl_infof(data_00,"connect to %s port %ld failed: %s\n",local_a8,lVar6,pcVar8);
              local_d0 = lVar5;
              if (conn->tempaddr[(int)local_60]->ai_next != (Curl_addrinfo *)0x0) {
                local_d0 = lVar5 / 2;
              }
              conn->timeoutms_per_addr = local_d0;
              allow._4_4_ = trynextip(conn,sockindex,local_60);
            }
          }
        }
      }
      if (allow._4_4_ != CURLE_OK) {
        if ((conn->tempaddr[1] == (Curl_addrinfo *)0x0) &&
           (CVar4 = trynextip(conn,sockindex,1), CVar4 == CURLE_OK)) {
          return CURLE_OK;
        }
        if (((conn->bits).proxy & 1U) == 0) {
          local_e0 = (conn->host).name;
        }
        else {
          local_e0 = (conn->proxy).name;
        }
        lVar5 = conn->port;
        pcVar8 = Curl_strerror(conn,now.tv_usec._4_4_);
        Curl_failf(data_00,"Failed to connect to %s port %ld: %s",local_e0,lVar5,pcVar8);
      }
      conn_local._4_4_ = allow._4_4_;
    }
  }
  else {
    *connected = true;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct SessionHandle *data = conn->data;
  CURLcode code = CURLE_OK;
  long allow;
  int error = 0;
  struct timeval now;
  int result;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    result = Curl_socket_ready(CURL_SOCKET_BAD, conn->tempsock[i], 0);

    if(result == 0) { /* no connection yet */
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(result == CURL_CSELECT_OUT) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */
        int other = i ^ 1;

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        code = Curl_connected_proxy(conn, sockindex);
        if(code)
          return code;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      else
        infof(data, "Connection failed\n");
    }
    else if(result & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      char ipaddress[MAX_IPADR_LEN];
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        code = trynextip(conn, sockindex, i);
      }
    }
  }

  if(code) {
    /* no more addresses to try */

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      int rc;
      rc = trynextip(conn, sockindex, 1);
      if(rc == CURLE_OK)
        return CURLE_OK;
    }

    failf(data, "Failed to connect to %s port %ld: %s",
          conn->bits.proxy?conn->proxy.name:conn->host.name,
          conn->port, Curl_strerror(conn, error));
  }

  return code;
}